

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvt.h
# Opt level: O3

void __thiscall
btDbvtBroadphase::getBroadphaseAabb(btDbvtBroadphase *this,btVector3 *aabbMin,btVector3 *aabbMax)

{
  btScalar *pbVar1;
  btScalar *pbVar2;
  long lVar3;
  float fVar4;
  btDbvtVolume bounds;
  
  pbVar1 = *(btScalar **)&this->field_0x8;
  pbVar2 = *(btScalar **)&this->field_0x68;
  if (pbVar1 == (btScalar *)0x0) {
    if (pbVar2 == (btScalar *)0x0) {
      bounds.mi.m_floats[0] = 0.0;
      bounds.mi.m_floats[1] = 0.0;
      bounds.mi.m_floats[2] = 0.0;
      bounds.mi.m_floats[3] = 0.0;
      bounds.mx.m_floats[0] = 0.0;
      bounds.mx.m_floats[1] = 0.0;
      bounds.mx.m_floats[2] = 0.0;
      bounds.mx.m_floats[3] = 0.0;
      goto LAB_00135b12;
    }
    bounds.mi.m_floats[0] = *pbVar2;
    bounds.mi.m_floats[1] = pbVar2[1];
    bounds.mi.m_floats[2] = pbVar2[2];
    bounds.mi.m_floats[3] = pbVar2[3];
    bounds.mx.m_floats[0] = pbVar2[4];
    bounds.mx.m_floats[1] = pbVar2[5];
    bounds.mx.m_floats[2] = pbVar2[6];
    bounds.mx.m_floats[3] = pbVar2[7];
  }
  else {
    if (pbVar2 != (btScalar *)0x0) {
      lVar3 = 0;
      do {
        fVar4 = pbVar1[lVar3];
        if (pbVar2[lVar3] <= pbVar1[lVar3]) {
          fVar4 = pbVar2[lVar3];
        }
        bounds.mi.m_floats[lVar3] = fVar4;
        fVar4 = pbVar1[lVar3 + 4];
        if (pbVar1[lVar3 + 4] <= pbVar2[lVar3 + 4]) {
          fVar4 = pbVar2[lVar3 + 4];
        }
        bounds.mx.m_floats[lVar3] = fVar4;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 3);
      goto LAB_00135b12;
    }
    bounds.mi.m_floats[0] = *pbVar1;
    bounds.mi.m_floats[1] = pbVar1[1];
    bounds.mi.m_floats[2] = pbVar1[2];
    bounds.mi.m_floats[3] = pbVar1[3];
    bounds.mx.m_floats[0] = pbVar1[4];
    bounds.mx.m_floats[1] = pbVar1[5];
    bounds.mx.m_floats[2] = pbVar1[6];
    bounds.mx.m_floats[3] = pbVar1[7];
  }
LAB_00135b12:
  *(ulong *)aabbMin->m_floats = CONCAT44(bounds.mi.m_floats[1],bounds.mi.m_floats[0]);
  *(ulong *)(aabbMin->m_floats + 2) = CONCAT44(bounds.mi.m_floats[3],bounds.mi.m_floats[2]);
  *(undefined8 *)aabbMax->m_floats = bounds.mx.m_floats._0_8_;
  *(undefined8 *)(aabbMax->m_floats + 2) = bounds.mx.m_floats._8_8_;
  return;
}

Assistant:

bool			empty() const { return(0==m_root); }